

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O1

void __thiscall SaiTreeView::PrintVirtualFileEntry(SaiTreeView *this,VirtualFileEntry *Entry)

{
  tm *__tp;
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  time_t TimeStamp;
  char TimeString [32];
  time_t local_50;
  char local_48 [32];
  
  local_50 = sai::VirtualFileEntry::GetTimeStamp(Entry);
  __tp = localtime(&local_50);
  strftime(local_48,0x20,"%D %R",__tp);
  if (this->FolderDepth != 0) {
    uVar3 = 0;
    do {
      fputs(anon_var_dwarf_37f5,_stdout);
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->FolderDepth);
  }
  sVar1 = sai::VirtualFileEntry::GetSize(Entry);
  pcVar2 = sai::VirtualFileEntry::GetName(Entry);
  printf(anon_var_dwarf_37df,sVar1,local_48,pcVar2);
  return;
}

Assistant:

void PrintVirtualFileEntry(const sai::VirtualFileEntry& Entry) const
	{
		const std::time_t TimeStamp = Entry.GetTimeStamp();
		char              TimeString[32];
		std::strftime(TimeString, 32, "%D %R", std::localtime(&TimeStamp));
		PrintNestedFolder();
		std::printf(
			"\u251C\u2500\u2500 [%12zu %s] %s\n", Entry.GetSize(), TimeString, Entry.GetName()
		);
	}